

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O0

void free_buckets(__cilkrts_worker *w,bucket **buckets,size_t nbuckets)

{
  bucket **in_RDX;
  __cilkrts_worker *in_RSI;
  size_t i;
  bucket **size;
  
  for (size = (bucket **)0x0; size < in_RDX; size = (bucket **)((long)size + 1)) {
    free_bucket(in_RSI,in_RDX);
  }
  __cilkrts_frame_free(in_RSI,in_RDX,(size_t)size);
  return;
}

Assistant:

static void free_buckets(__cilkrts_worker  *w, 
                         bucket           **buckets,
                         size_t             nbuckets)
{
    size_t i;

#if REDPAR_DEBUG >= 1
    verify_current_wkr(w);
    fprintf(stderr, "W=%d, desc=free_buckets, buckets=%p, size=%zd\n",
	    w->self, buckets,
	    nbuckets * sizeof(*buckets));
#endif

    for (i = 0; i < nbuckets; ++i)
        free_bucket(w, buckets + i);

    __cilkrts_frame_free(w, buckets, nbuckets * sizeof(*buckets));
}